

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_baload(ExecutionEngine *this)

{
  int iVar1;
  uint32_t uVar2;
  VMStack *this_00;
  Frame *this_01;
  ostream *poVar3;
  ulong uVar4;
  anon_union_8_10_52016fac_for_data aVar5;
  undefined8 uVar6;
  uint index;
  Value VVar7;
  Value VVar8;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar7 = Frame::popTopOfOperandStack(this_01);
  if (VVar7.type != INT) {
    __assert_fail("index.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x422,"void ExecutionEngine::i_baload()");
  }
  VVar8 = Frame::popTopOfOperandStack(this_01);
  aVar5 = VVar8.data;
  if ((VVar8._0_8_ & 0xffffffff00000000) != 0x900000000) {
    __assert_fail("arrayref.type == ValueType::REFERENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x424,"void ExecutionEngine::i_baload()");
  }
  iVar1 = (**((Object *)&(aVar5.object)->_vptr_Object)->_vptr_Object)(aVar5.longValue);
  if (iVar1 != 2) {
    __assert_fail("(arrayref.data.object)->objectType() == ObjectType::ARRAY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x425,"void ExecutionEngine::i_baload()");
  }
  uVar2 = ArrayObject::getSize((ArrayObject *)aVar5.object);
  index = VVar7.data._0_4_;
  if ((-1 < (int)index) && (index <= uVar2)) {
    VVar7 = ArrayObject::getValue((ArrayObject *)aVar5.object,index);
    uVar4 = VVar7._0_8_ >> 0x20;
    if ((VVar7._0_8_ & 0xffffffff00000000) == 0x100000000 || uVar4 == 0) {
      uVar6 = 0x400000000;
      if (uVar4 == 0) {
        aVar5.longValue = VVar7.data.longValue & 0xffffffff00000001;
      }
      else {
        aVar5.longValue =
             VVar7.data.longValue & 0xffffffff00000000U | (ulong)(uint)(int)VVar7.data._0_1_;
        uVar6 = 0x400000001;
      }
      VVar7.data.longValue = aVar5.longValue;
      VVar7.printType = (int)uVar6;
      VVar7.type = (int)((ulong)uVar6 >> 0x20);
      Frame::pushIntoOperandStack(this_01,VVar7);
      this_01->pc = this_01->pc + 1;
      return;
    }
    __assert_fail("value.type == ValueType::BOOLEAN || value.type == ValueType::BYTE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x433,"void ExecutionEngine::i_baload()");
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"ArrayIndexOutOfBoundsException");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(2);
}

Assistant:

void ExecutionEngine::i_baload() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
	ArrayObject *array;

    Value index = topFrame->popTopOfOperandStack();
    assert(index.type == ValueType::INT);
    Value arrayref = topFrame->popTopOfOperandStack();
    assert(arrayref.type == ValueType::REFERENCE);
    assert((arrayref.data.object)->objectType() == ObjectType::ARRAY);

    array = (ArrayObject *) arrayref.data.object;

    if (array == NULL) {
        cerr << "NullPointerException" << endl;
        exit(1);
    }
    if (index.data.intValue > array->getSize() || index.data.intValue < 0) {
        cerr << "ArrayIndexOutOfBoundsException" << endl;
        exit(2);
    }

    Value value = array->getValue(index.data.intValue);
    assert(value.type == ValueType::BOOLEAN || value.type == ValueType::BYTE);
    
    if (value.type == ValueType::BOOLEAN) {
        value.data.intValue = (uint32_t) value.data.booleanValue;
        value.printType = ValueType::BOOLEAN;
    } else {
        value.data.intValue = (int32_t) value.data.byteValue;
        value.printType = ValueType::BYTE;
    }
    value.type = ValueType::INT;

    topFrame->pushIntoOperandStack(value);
    topFrame->pc += 1;
}